

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_textedit.h
# Opt level: O0

int ImGuiStb::stb_textedit_paste
              (ImGuiTextEditState *str,STB_TexteditState *state,ImWchar *ctext,int len)

{
  bool bVar1;
  ImWchar *text;
  int len_local;
  ImWchar *ctext_local;
  STB_TexteditState *state_local;
  ImGuiTextEditState *str_local;
  
  stb_textedit_clamp(str,state);
  stb_textedit_delete_selection(str,state);
  bVar1 = STB_TEXTEDIT_INSERTCHARS(str,state->cursor,ctext,len);
  if (bVar1) {
    stb_text_makeundo_insert(state,state->cursor,len);
    state->cursor = len + state->cursor;
    state->has_preferred_x = '\0';
    str_local._4_4_ = 1;
  }
  else {
    if ((state->undostate).undo_point != 0) {
      (state->undostate).undo_point = (state->undostate).undo_point + -1;
    }
    str_local._4_4_ = 0;
  }
  return str_local._4_4_;
}

Assistant:

static int stb_textedit_paste(STB_TEXTEDIT_STRING *str, STB_TexteditState *state, STB_TEXTEDIT_CHARTYPE const *ctext, int len)
{
   STB_TEXTEDIT_CHARTYPE *text = (STB_TEXTEDIT_CHARTYPE *) ctext;
   // if there's a selection, the paste should delete it
   stb_textedit_clamp(str, state);
   stb_textedit_delete_selection(str,state);
   // try to insert the characters
   if (STB_TEXTEDIT_INSERTCHARS(str, state->cursor, text, len)) {
      stb_text_makeundo_insert(state, state->cursor, len);
      state->cursor += len;
      state->has_preferred_x = 0;
      return 1;
   }
   // remove the undo since we didn't actually insert the characters
   if (state->undostate.undo_point)
      --state->undostate.undo_point;
   return 0;
}